

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isastubs.c
# Opt level: O1

parasail_result_t *
parasail_sg_qb_de_table_diag_neon_128_8
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0x26;
  return (parasail_result_t *)0x0;
}

Assistant:

extern
parasail_result_t* parasail_sg_qb_de_table_diag_neon_128_8(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t* matrix)
{
    UNUSED(s1);
    UNUSED(s1Len);
    UNUSED(s2);
    UNUSED(s2Len);
    UNUSED(open);
    UNUSED(gap);
    UNUSED(matrix);
    errno = ENOSYS;
    return NULL;
}